

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[22],std::__cxx11::string,char[15],char[13],char[8],Diligent::MemorySizeFormatter<unsigned_long>,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [22],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1,
          char (*Args_2) [15],char (*Args_3) [13],char (*Args_4) [8],
          MemorySizeFormatter<unsigned_long> *Args_5,char (*Args_6) [28],
          MemorySizeFormatter<unsigned_long> *Args_7)

{
  stringstream local_1c8 [8];
  stringstream ss;
  char (*Args_local_4) [8];
  char (*Args_local_3) [13];
  char (*Args_local_2) [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_local_1;
  char (*Args_local) [22];
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  FormatStrSS<std::__cxx11::stringstream,char[22],std::__cxx11::string,char[15],char[13],char[8],Diligent::MemorySizeFormatter<unsigned_long>,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (char (*) [22])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
             (char (*) [15])Args_1,(char (*) [13])Args_2,(char (*) [8])Args_3,
             (MemorySizeFormatter<unsigned_long> *)Args_4,(char (*) [28])Args_5,
             (MemorySizeFormatter<unsigned_long> *)Args_6);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}